

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<RPCResult,_std::allocator<RPCResult>_> *
Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
          (vector<RPCResult,_std::allocator<RPCResult>_> *v1,
          vector<RPCResult,_std::allocator<RPCResult>_> *v2)

{
  long lVar1;
  bool bVar2;
  size_type in_RDX;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RSI;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  RPCResult *arg;
  vector<RPCResult,_std::allocator<RPCResult>_> *__range1;
  iterator __end0;
  iterator __begin0;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffff98;
  vector<RPCResult,_std::allocator<RPCResult>_> *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::size(in_stack_ffffffffffffff98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::size(in_stack_ffffffffffffff98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve(in_RSI,in_RDX);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::begin(in_RDI);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                      ((__normal_iterator<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                        *)__lhs,(__normal_iterator<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                                 *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>::
    operator*((__normal_iterator<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_> *
              )in_stack_ffffffffffffff98);
    std::vector<RPCResult,_std::allocator<RPCResult>_>::push_back
              (in_stack_ffffffffffffff98,(value_type *)0x5a0982);
    __gnu_cxx::__normal_iterator<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>::
    operator++((__normal_iterator<RPCResult_*,_std::vector<RPCResult,_std::allocator<RPCResult>_>_>
                *)in_stack_ffffffffffffff98);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_stack_ffffffffffffff98,(vector<RPCResult,_std::allocator<RPCResult>_> *)0x5a099d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, V&& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (auto& arg : v2) {
        v1.push_back(std::move(arg));
    }
    return v1;
}